

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

bool boolFromString(string *value,bool *bool_value)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 uVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __lhs_00;
  undefined1 *in_RSI;
  char *in_RDI;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::string::begin();
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::string::end();
  uVar3 = std::__cxx11::string::begin();
  __lhs_00 = std::
             transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boolFromString(std::__cxx11::string,bool&)::__0>
                       (__lhs,__rhs,uVar3);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __lhs_00._M_current,in_RDI);
  if ((((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs_00._M_current,in_RDI), bVar1)) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __lhs_00._M_current,in_RDI), bVar1)) ||
     (_Var2 = std::operator==(__lhs,__rhs), _Var2)) {
    *in_RSI = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs_00._M_current,in_RDI);
    if (((!bVar1) &&
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__lhs_00._M_current,in_RDI), !bVar1)) &&
       ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__lhs_00._M_current,in_RDI), !bVar1 &&
        (_Var2 = std::operator==(__lhs,__rhs), !_Var2)))) {
      return false;
    }
    *in_RSI = 0;
  }
  return true;
}

Assistant:

bool boolFromString(std::string value, bool& bool_value) {
  std::transform(value.begin(), value.end(), value.begin(),
                 [](unsigned char c) { return std::tolower(c); });
  if (value == "t" || value == "true" || value == "1" ||
      value == kHighsOnString) {
    bool_value = true;
  } else if (value == "f" || value == "false" || value == "0" ||
             value == kHighsOffString) {
    bool_value = false;
  } else {
    return false;
  }
  return true;
}